

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerHLSL::write_access_chain
          (CompilerHLSL *this,SPIRAccessChain *chain,uint32_t value,
          SmallVector<unsigned_int,_8UL> *composite_chain)

{
  pointer pcVar1;
  bool bVar2;
  uint uVar3;
  SPIRType *type;
  string *psVar4;
  runtime_error *prVar5;
  uint uVar6;
  uint32_t uVar7;
  char (*in_R8) [2];
  string *in_R9;
  string *ts_3;
  char *store_op;
  uint32_t local_39c;
  string bitcast_op;
  uint local_36c;
  SPIRAccessChain *local_368;
  SmallVector<unsigned_int,_8UL> *local_360;
  string local_358;
  string template_expr;
  string base;
  SPIRType scalar_type;
  undefined **local_190;
  undefined4 local_188;
  undefined4 local_184;
  undefined4 local_180;
  undefined4 local_17c;
  undefined8 local_178;
  undefined1 *local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined1 local_158 [32];
  undefined1 *local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined1 local_120 [8];
  undefined4 local_118;
  undefined2 local_114;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined4 local_100;
  undefined1 *local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined1 local_e0 [32];
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined1 local_a8 [32];
  undefined7 local_88;
  undefined4 uStack_81;
  undefined8 local_7c;
  undefined8 uStack_74;
  undefined4 local_6c;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  local_39c = value;
  local_360 = composite_chain;
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>.ptr +
                    *(uint *)&(chain->super_IVariant).field_0xc);
  CompilerGLSL::track_expression_read(&this->super_CompilerGLSL,(chain->super_IVariant).self.id);
  bVar2 = Compiler::is_scalar((Compiler *)this,type);
  local_184 = 0x15;
  if (!bVar2) {
    local_184 = *(undefined4 *)&(type->super_IVariant).field_0xc;
  }
  local_170 = local_158;
  local_188 = 0;
  local_190 = &PTR__SPIRType_0048ff28;
  local_17c = 0;
  local_168 = 0;
  local_160 = 8;
  local_138 = local_120;
  local_130 = 0;
  local_128 = 8;
  local_118 = 0;
  local_114 = 0;
  local_110 = 0;
  uStack_108 = 0;
  local_100 = 8;
  local_f8 = local_e0;
  local_f0 = 0;
  local_e8 = 8;
  local_c0 = local_a8;
  local_b8 = 0;
  local_b0 = 8;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_88 = 0;
  uStack_81 = 0;
  local_7c = 0;
  uStack_74 = 0;
  local_6c = 0;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_180 = 8;
  local_178._0_4_ = type->vecsize;
  local_178._4_4_ = type->columns;
  if ((type->array).super_VectorView<unsigned_int>.buffer_size == 0) {
    if (type->basetype != Struct) {
      if ((type->width != 0x20) && ((this->hlsl_options).enable_16bit_types == false)) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error
                  (prVar5,
                   "Writing types other than 32-bit to RWByteAddressBuffer not yet supported, unless SM 6.2 and native 16-bit types are enabled."
                  );
        *(undefined ***)prVar5 = &PTR__runtime_error_0048ff00;
        __cxa_throw(prVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      uVar3 = (this->hlsl_options).shader_model;
      base._M_dataplus._M_p = (pointer)&base.field_2;
      pcVar1 = (chain->base)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&base,pcVar1,pcVar1 + (chain->base)._M_string_length);
      bVar2 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(chain->super_IVariant).self.id,DecorationNonUniform);
      if (bVar2) {
        CompilerGLSL::convert_non_uniform_expression
                  (&this->super_CompilerGLSL,&base,(chain->super_IVariant).self.id);
      }
      template_expr._M_dataplus._M_p = (pointer)&template_expr.field_2;
      template_expr._M_string_length = 0;
      template_expr.field_2._M_local_buf[0] = '\0';
      if (0x3d < uVar3) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&bitcast_op,this,type,0);
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  ((string *)&scalar_type,(spirv_cross *)0x353fcd,(char (*) [2])&bitcast_op,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x395c2f,
                   in_R8);
        ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&scalar_type);
        if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.basetype) {
          operator_delete(scalar_type.super_IVariant._vptr_IVariant);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,(int)bitcast_op._M_dataplus._M_p) !=
            &bitcast_op.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,
                                   (int)bitcast_op._M_dataplus._M_p));
        }
      }
      uVar7 = type->columns;
      local_368 = chain;
      if (uVar7 == 1) {
        if (chain->row_major_matrix == false) {
          store_op = (char *)0x0;
          switch(type->vecsize) {
          case 1:
            store_op = "Store";
            break;
          case 2:
            store_op = "Store2";
            break;
          case 3:
            store_op = "Store3";
            break;
          case 4:
            store_op = "Store4";
            break;
          default:
            prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
            ::std::runtime_error::runtime_error(prVar5,"Unknown vector size.");
            *(undefined ***)prVar5 = &PTR__runtime_error_0048ff00;
            __cxa_throw(prVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          write_access_chain_value_abi_cxx11_((string *)&scalar_type,this,local_39c,local_360,false)
          ;
          if (uVar3 < 0x3e) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3c])
                      (&bitcast_op,this,&local_190,type);
            if (bitcast_op._M_string_length != 0) {
              join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                        (&local_358,(spirv_cross *)&bitcast_op,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x398789,(char (*) [2])&scalar_type,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x3a4196,(char (*) [2])in_R9);
              ::std::__cxx11::string::operator=((string *)&scalar_type,(string *)&local_358);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_358._M_dataplus._M_p != &local_358.field_2) {
                operator_delete(local_358._M_dataplus._M_p);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,(int)bitcast_op._M_dataplus._M_p) !=
                &bitcast_op.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,
                                       (int)bitcast_op._M_dataplus._M_p));
            }
          }
          else {
            store_op = "Store";
          }
          CompilerGLSL::
          statement<std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,int_const&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                    (&this->super_CompilerGLSL,&base,(char (*) [2])0x34fc6b,&store_op,&template_expr
                     ,(char (*) [2])0x398789,&chain->dynamic_index,&chain->static_index,
                     (char (*) [3])0x394b62,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &scalar_type,(char (*) [3])0x3a31d3);
          if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.basetype) {
            operator_delete(scalar_type.super_IVariant._vptr_IVariant);
          }
        }
        else {
          if (0x3d < uVar3) {
            SPIRType::SPIRType(&scalar_type,type);
            scalar_type.vecsize = 1;
            scalar_type.columns = 1;
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (&local_358,this,&scalar_type,0);
            join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                      (&bitcast_op,(spirv_cross *)0x353fcd,(char (*) [2])&local_358,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x395c2f
                       ,in_R8);
            ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&bitcast_op);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,(int)bitcast_op._M_dataplus._M_p) !=
                &bitcast_op.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,
                                       (int)bitcast_op._M_dataplus._M_p));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358._M_dataplus._M_p != &local_358.field_2) {
              operator_delete(local_358._M_dataplus._M_p);
            }
            scalar_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_0048ff28;
            ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::~_Hashtable(&scalar_type.member_name_cache._M_h);
            scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0
            ;
            if ((AlignedBuffer<unsigned_int,_8UL> *)
                scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
                &scalar_type.member_type_index_redirection.stack_storage) {
              free(scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
            }
            scalar_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size = 0;
            if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                scalar_type.member_types.
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr !=
                &scalar_type.member_types.stack_storage) {
              free(scalar_type.member_types.
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr);
            }
            scalar_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
            if ((AlignedBuffer<bool,_8UL> *)
                scalar_type.array_size_literal.super_VectorView<bool>.ptr !=
                &scalar_type.array_size_literal.stack_storage) {
              free(scalar_type.array_size_literal.super_VectorView<bool>.ptr);
            }
            scalar_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
            if ((AlignedBuffer<unsigned_int,_8UL> *)
                scalar_type.array.super_VectorView<unsigned_int>.ptr !=
                &scalar_type.array.stack_storage) {
              free(scalar_type.array.super_VectorView<unsigned_int>.ptr);
            }
          }
          if (type->vecsize != 0) {
            psVar4 = &local_368->dynamic_index;
            uVar7 = 0;
            do {
              write_access_chain_value_abi_cxx11_
                        ((string *)&scalar_type,this,local_39c,local_360,true);
              if (1 < type->vecsize) {
                ::std::__cxx11::string::append((char *)&scalar_type);
                CompilerGLSL::index_to_swizzle(&this->super_CompilerGLSL,uVar7);
                ::std::__cxx11::string::append((char *)&scalar_type);
              }
              CompilerGLSL::remove_duplicate_swizzle
                        (&this->super_CompilerGLSL,(string *)&scalar_type);
              if (uVar3 < 0x3e) {
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3c])
                          (&bitcast_op,this,&local_190,type);
                if (bitcast_op._M_string_length != 0) {
                  join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                            (&local_358,(spirv_cross *)&bitcast_op,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x398789,(char (*) [2])&scalar_type,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x3a4196,(char (*) [2])in_R9);
                  ::std::__cxx11::string::operator=((string *)&scalar_type,(string *)&local_358);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_358._M_dataplus._M_p != &local_358.field_2) {
                    operator_delete(local_358._M_dataplus._M_p);
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,(int)bitcast_op._M_dataplus._M_p)
                    != &bitcast_op.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,
                                           (int)bitcast_op._M_dataplus._M_p));
                }
              }
              bitcast_op._M_dataplus._M_p._0_4_ =
                   local_368->matrix_stride * uVar7 + local_368->static_index;
              in_R9 = psVar4;
              CompilerGLSL::
              statement<std::__cxx11::string&,char_const(&)[7],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                        (&this->super_CompilerGLSL,&base,(char (*) [7])".Store",&template_expr,
                         (char (*) [2])0x398789,psVar4,(uint *)&bitcast_op,(char (*) [3])0x394b62,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &scalar_type,(char (*) [3])0x3a31d3);
              if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.basetype)
              {
                operator_delete(scalar_type.super_IVariant._vptr_IVariant);
              }
              uVar7 = uVar7 + 1;
            } while (uVar7 < type->vecsize);
          }
        }
      }
      else if (chain->row_major_matrix == false) {
        store_op = (char *)0x0;
        switch(type->vecsize) {
        case 1:
          store_op = "Store";
          break;
        case 2:
          store_op = "Store2";
          break;
        case 3:
          store_op = "Store3";
          break;
        case 4:
          store_op = "Store4";
          break;
        default:
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error(prVar5,"Unknown vector size.");
          *(undefined ***)prVar5 = &PTR__runtime_error_0048ff00;
          __cxa_throw(prVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (0x3d < uVar3) {
          store_op = "Store";
          SPIRType::SPIRType(&scalar_type,type);
          scalar_type.columns = 1;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_358,this,&scalar_type,0);
          join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                    (&bitcast_op,(spirv_cross *)0x353fcd,(char (*) [2])&local_358,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x395c2f,
                     in_R8);
          ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&bitcast_op);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,(int)bitcast_op._M_dataplus._M_p) !=
              &bitcast_op.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,
                                     (int)bitcast_op._M_dataplus._M_p));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358._M_dataplus._M_p != &local_358.field_2) {
            operator_delete(local_358._M_dataplus._M_p);
          }
          scalar_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_0048ff28;
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable(&scalar_type.member_name_cache._M_h);
          scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
          if ((AlignedBuffer<unsigned_int,_8UL> *)
              scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
              &scalar_type.member_type_index_redirection.stack_storage) {
            free(scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
          }
          scalar_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
          buffer_size = 0;
          if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
              scalar_type.member_types.
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr !=
              &scalar_type.member_types.stack_storage) {
            free(scalar_type.member_types.
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr);
          }
          scalar_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
          if ((AlignedBuffer<bool,_8UL> *)scalar_type.array_size_literal.super_VectorView<bool>.ptr
              != &scalar_type.array_size_literal.stack_storage) {
            free(scalar_type.array_size_literal.super_VectorView<bool>.ptr);
          }
          scalar_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
          if ((AlignedBuffer<unsigned_int,_8UL> *)
              scalar_type.array.super_VectorView<unsigned_int>.ptr !=
              &scalar_type.array.stack_storage) {
            free(scalar_type.array.super_VectorView<unsigned_int>.ptr);
          }
          uVar7 = type->columns;
        }
        local_36c = 0;
        if (uVar7 != 0) {
          psVar4 = &local_368->dynamic_index;
          do {
            write_access_chain_value_abi_cxx11_(&bitcast_op,this,local_39c,local_360,true);
            join<std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2]>
                      ((string *)&scalar_type,(spirv_cross *)&bitcast_op,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3837e2
                       ,(char (*) [2])&local_36c,(uint *)0x3836e7,(char (*) [2])in_R9);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,(int)bitcast_op._M_dataplus._M_p) !=
                &bitcast_op.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,
                                       (int)bitcast_op._M_dataplus._M_p));
            }
            if (uVar3 < 0x3e) {
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3c])
                        (&bitcast_op,this,&local_190,type);
              if (bitcast_op._M_string_length != 0) {
                join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                          (&local_358,(spirv_cross *)&bitcast_op,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x398789,(char (*) [2])&scalar_type,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x3a4196,(char (*) [2])in_R9);
                ::std::__cxx11::string::operator=((string *)&scalar_type,(string *)&local_358);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_358._M_dataplus._M_p != &local_358.field_2) {
                  operator_delete(local_358._M_dataplus._M_p);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,(int)bitcast_op._M_dataplus._M_p) !=
                  &bitcast_op.field_2) {
                operator_delete((undefined1 *)
                                CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,
                                         (int)bitcast_op._M_dataplus._M_p));
              }
            }
            bitcast_op._M_dataplus._M_p._0_4_ =
                 local_368->matrix_stride * local_36c + local_368->static_index;
            in_R9 = (string *)0x398789;
            CompilerGLSL::
            statement<std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                      (&this->super_CompilerGLSL,&base,(char (*) [2])0x34fc6b,&store_op,
                       &template_expr,(char (*) [2])0x398789,psVar4,(uint *)&bitcast_op,
                       (char (*) [3])0x394b62,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &scalar_type,(char (*) [3])0x3a31d3);
            if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.basetype) {
              operator_delete(scalar_type.super_IVariant._vptr_IVariant);
            }
            local_36c = local_36c + 1;
          } while (local_36c < type->columns);
        }
      }
      else {
        if (0x3d < uVar3) {
          SPIRType::SPIRType(&scalar_type,type);
          scalar_type.vecsize = 1;
          scalar_type.columns = 1;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_358,this,&scalar_type,0);
          join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                    (&bitcast_op,(spirv_cross *)0x353fcd,(char (*) [2])&local_358,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x395c2f,
                     in_R8);
          ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&bitcast_op);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,(int)bitcast_op._M_dataplus._M_p) !=
              &bitcast_op.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,
                                     (int)bitcast_op._M_dataplus._M_p));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358._M_dataplus._M_p != &local_358.field_2) {
            operator_delete(local_358._M_dataplus._M_p);
          }
          scalar_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_0048ff28;
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable(&scalar_type.member_name_cache._M_h);
          scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
          if ((AlignedBuffer<unsigned_int,_8UL> *)
              scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
              &scalar_type.member_type_index_redirection.stack_storage) {
            free(scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
          }
          scalar_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
          buffer_size = 0;
          if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
              scalar_type.member_types.
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr !=
              &scalar_type.member_types.stack_storage) {
            free(scalar_type.member_types.
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr);
          }
          scalar_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
          if ((AlignedBuffer<bool,_8UL> *)scalar_type.array_size_literal.super_VectorView<bool>.ptr
              != &scalar_type.array_size_literal.stack_storage) {
            free(scalar_type.array_size_literal.super_VectorView<bool>.ptr);
          }
          scalar_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
          if ((AlignedBuffer<unsigned_int,_8UL> *)
              scalar_type.array.super_VectorView<unsigned_int>.ptr !=
              &scalar_type.array.stack_storage) {
            free(scalar_type.array.super_VectorView<unsigned_int>.ptr);
          }
        }
        uVar3 = type->vecsize;
        if (uVar3 != 0) {
          psVar4 = &local_368->dynamic_index;
          uVar6 = type->columns;
          uVar7 = 0;
          do {
            store_op = (char *)((ulong)store_op & 0xffffffff00000000);
            bVar2 = uVar6 != 0;
            uVar6 = 0;
            if (bVar2) {
              do {
                write_access_chain_value_abi_cxx11_(&bitcast_op,this,local_39c,local_360,true);
                local_358._M_dataplus._M_p =
                     CompilerGLSL::index_to_swizzle(&this->super_CompilerGLSL,uVar7);
                ts_3 = &local_358;
                join<std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[3],char_const*>
                          ((string *)&scalar_type,(spirv_cross *)&bitcast_op,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x3837e2,(char (*) [2])&store_op,(uint *)0x3a45ec,
                           (char (*) [3])&local_358,(char **)store_op);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,(int)bitcast_op._M_dataplus._M_p)
                    != &bitcast_op.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,
                                           (int)bitcast_op._M_dataplus._M_p));
                }
                CompilerGLSL::remove_duplicate_swizzle
                          (&this->super_CompilerGLSL,(string *)&scalar_type);
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3c])
                          (&bitcast_op,this,&local_190,type);
                if (bitcast_op._M_string_length != 0) {
                  join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                            (&local_358,(spirv_cross *)&bitcast_op,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x398789,(char (*) [2])&scalar_type,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x3a4196,(char (*) [2])ts_3);
                  ::std::__cxx11::string::operator=((string *)&scalar_type,(string *)&local_358);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_358._M_dataplus._M_p != &local_358.field_2) {
                    operator_delete(local_358._M_dataplus._M_p);
                  }
                }
                local_358._M_dataplus._M_p._0_4_ =
                     local_368->matrix_stride * uVar7 +
                     (type->width >> 3) * (int)store_op + local_368->static_index;
                CompilerGLSL::
                statement<std::__cxx11::string&,char_const(&)[7],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                          (&this->super_CompilerGLSL,&base,(char (*) [7])".Store",&template_expr,
                           (char (*) [2])0x398789,psVar4,(uint *)&local_358,(char (*) [3])0x394b62,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &scalar_type,(char (*) [3])0x3a31d3);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,(int)bitcast_op._M_dataplus._M_p)
                    != &bitcast_op.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,
                                           (int)bitcast_op._M_dataplus._M_p));
                }
                if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.basetype
                   ) {
                  operator_delete(scalar_type.super_IVariant._vptr_IVariant);
                }
                uVar3 = (int)store_op + 1;
                store_op = (char *)CONCAT44(store_op._4_4_,uVar3);
                uVar6 = type->columns;
              } while (uVar3 < uVar6);
              uVar3 = type->vecsize;
            }
            uVar7 = uVar7 + 1;
          } while (uVar7 < uVar3);
        }
      }
      Compiler::register_write((Compiler *)this,(local_368->super_IVariant).self.id);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)template_expr._M_dataplus._M_p != &template_expr.field_2) {
        operator_delete(template_expr._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)base._M_dataplus._M_p != &base.field_2) {
        operator_delete(base._M_dataplus._M_p);
      }
      goto LAB_001d8c41;
    }
    write_access_chain_struct(this,chain,local_39c,local_360);
  }
  else {
    write_access_chain_array(this,chain,local_39c,local_360);
  }
  Compiler::register_write((Compiler *)this,(chain->super_IVariant).self.id);
LAB_001d8c41:
  local_190 = &PTR__SPIRType_0048ff28;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  local_b8 = 0;
  if (local_c0 != local_a8) {
    free(local_c0);
  }
  local_f0 = 0;
  if (local_f8 != local_e0) {
    free(local_f8);
  }
  local_130 = 0;
  if (local_138 != local_120) {
    free(local_138);
  }
  local_168 = 0;
  if (local_170 != local_158) {
    free(local_170);
  }
  return;
}

Assistant:

void CompilerHLSL::write_access_chain(const SPIRAccessChain &chain, uint32_t value,
                                      const SmallVector<uint32_t> &composite_chain)
{
	auto &type = get<SPIRType>(chain.basetype);

	// Make sure we trigger a read of the constituents in the access chain.
	track_expression_read(chain.self);

	SPIRType target_type { is_scalar(type) ? OpTypeInt : type.op };
	target_type.basetype = SPIRType::UInt;
	target_type.vecsize = type.vecsize;
	target_type.columns = type.columns;

	if (!type.array.empty())
	{
		write_access_chain_array(chain, value, composite_chain);
		register_write(chain.self);
		return;
	}
	else if (type.basetype == SPIRType::Struct)
	{
		write_access_chain_struct(chain, value, composite_chain);
		register_write(chain.self);
		return;
	}
	else if (type.width != 32 && !hlsl_options.enable_16bit_types)
		SPIRV_CROSS_THROW("Writing types other than 32-bit to RWByteAddressBuffer not yet supported, unless SM 6.2 and "
		                  "native 16-bit types are enabled.");

	bool templated_store = hlsl_options.shader_model >= 62;

	auto base = chain.base;
	if (has_decoration(chain.self, DecorationNonUniform))
		convert_non_uniform_expression(base, chain.self);

	string template_expr;
	if (templated_store)
		template_expr = join("<", type_to_glsl(type), ">");

	if (type.columns == 1 && !chain.row_major_matrix)
	{
		const char *store_op = nullptr;
		switch (type.vecsize)
		{
		case 1:
			store_op = "Store";
			break;
		case 2:
			store_op = "Store2";
			break;
		case 3:
			store_op = "Store3";
			break;
		case 4:
			store_op = "Store4";
			break;
		default:
			SPIRV_CROSS_THROW("Unknown vector size.");
		}

		auto store_expr = write_access_chain_value(value, composite_chain, false);

		if (!templated_store)
		{
			auto bitcast_op = bitcast_glsl_op(target_type, type);
			if (!bitcast_op.empty())
				store_expr = join(bitcast_op, "(", store_expr, ")");
		}
		else
			store_op = "Store";
		statement(base, ".", store_op, template_expr, "(", chain.dynamic_index, chain.static_index, ", ",
		          store_expr, ");");
	}
	else if (type.columns == 1)
	{
		if (templated_store)
		{
			auto scalar_type = type;
			scalar_type.vecsize = 1;
			scalar_type.columns = 1;
			template_expr = join("<", type_to_glsl(scalar_type), ">");
		}

		// Strided store.
		for (uint32_t r = 0; r < type.vecsize; r++)
		{
			auto store_expr = write_access_chain_value(value, composite_chain, true);
			if (type.vecsize > 1)
			{
				store_expr += ".";
				store_expr += index_to_swizzle(r);
			}
			remove_duplicate_swizzle(store_expr);

			if (!templated_store)
			{
				auto bitcast_op = bitcast_glsl_op(target_type, type);
				if (!bitcast_op.empty())
					store_expr = join(bitcast_op, "(", store_expr, ")");
			}

			statement(base, ".Store", template_expr, "(", chain.dynamic_index,
			          chain.static_index + chain.matrix_stride * r, ", ", store_expr, ");");
		}
	}
	else if (!chain.row_major_matrix)
	{
		const char *store_op = nullptr;
		switch (type.vecsize)
		{
		case 1:
			store_op = "Store";
			break;
		case 2:
			store_op = "Store2";
			break;
		case 3:
			store_op = "Store3";
			break;
		case 4:
			store_op = "Store4";
			break;
		default:
			SPIRV_CROSS_THROW("Unknown vector size.");
		}

		if (templated_store)
		{
			store_op = "Store";
			auto vector_type = type;
			vector_type.columns = 1;
			template_expr = join("<", type_to_glsl(vector_type), ">");
		}

		for (uint32_t c = 0; c < type.columns; c++)
		{
			auto store_expr = join(write_access_chain_value(value, composite_chain, true), "[", c, "]");

			if (!templated_store)
			{
				auto bitcast_op = bitcast_glsl_op(target_type, type);
				if (!bitcast_op.empty())
					store_expr = join(bitcast_op, "(", store_expr, ")");
			}

			statement(base, ".", store_op, template_expr, "(", chain.dynamic_index,
			          chain.static_index + c * chain.matrix_stride, ", ", store_expr, ");");
		}
	}
	else
	{
		if (templated_store)
		{
			auto scalar_type = type;
			scalar_type.vecsize = 1;
			scalar_type.columns = 1;
			template_expr = join("<", type_to_glsl(scalar_type), ">");
		}

		for (uint32_t r = 0; r < type.vecsize; r++)
		{
			for (uint32_t c = 0; c < type.columns; c++)
			{
				auto store_expr =
				    join(write_access_chain_value(value, composite_chain, true), "[", c, "].", index_to_swizzle(r));
				remove_duplicate_swizzle(store_expr);
				auto bitcast_op = bitcast_glsl_op(target_type, type);
				if (!bitcast_op.empty())
					store_expr = join(bitcast_op, "(", store_expr, ")");
				statement(base, ".Store", template_expr, "(", chain.dynamic_index,
				          chain.static_index + c * (type.width / 8) + r * chain.matrix_stride, ", ", store_expr, ");");
			}
		}
	}

	register_write(chain.self);
}